

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMulti(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_54;
  uint local_50;
  int fFactor;
  int fSimple;
  int fMulti;
  int fCnf;
  int c;
  int nFaninMax;
  int nThresh;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  c = 1;
  fCnf = 0x14;
  fSimple = 0;
  fFactor = 1;
  local_50 = 0;
  local_54 = 0;
  Extra_UtilGetoptReset();
LAB_00229eb1:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"TFmcsfh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"Cannot renode a network that is not an AIG (run \"strash\").\n");
        return 1;
      }
      pAVar2 = Abc_NtkMulti(pAVar2,c,fCnf,fSimple,fFactor,local_50,local_54);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Renoding has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0022a0b1;
      }
      fCnf = atoi(argv[globalUtilOptind]);
      iVar1 = fCnf;
      break;
    default:
      goto LAB_0022a0b1;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0022a0b1;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    case 99:
      fSimple = fSimple ^ 1;
      goto LAB_00229eb1;
    case 0x66:
      local_54 = local_54 ^ 1;
      goto LAB_00229eb1;
    case 0x68:
      goto LAB_0022a0b1;
    case 0x6d:
      fFactor = fFactor ^ 1;
      goto LAB_00229eb1;
    case 0x73:
      local_50 = local_50 ^ 1;
      goto LAB_00229eb1;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0022a0b1:
      Abc_Print(-2,"usage: multi [-TF <num>] [-msfch]\n");
      Abc_Print(-2,"\t          transforms an AIG into a logic network by creating larger nodes\n");
      Abc_Print(-2,"\t-F <num>: the maximum fanin size after renoding [default = %d]\n",
                (ulong)(uint)fCnf);
      Abc_Print(-2,"\t-T <num>: the threshold for AIG node duplication [default = %d]\n",
                (ulong)(uint)c);
      Abc_Print(-2,"\t          (an AIG node is the root of a new node after renoding\n");
      Abc_Print(-2,"\t          if this leads to duplication of no more than %d AIG nodes,\n",
                (ulong)(uint)c);
      Abc_Print(-2,"\t          that is, if [(numFanouts(Node)-1) * size(MFFC(Node))] <= %d)\n",
                (ulong)(uint)c);
      pcVar3 = "no";
      if (fFactor != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m      : creates multi-input AND graph [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_50 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s      : creates a simple AIG (no renoding) [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_54 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-f      : creates a factor-cut network [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fSimple != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c      : performs renoding to derive the CNF [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandMulti( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nThresh, nFaninMax, c;
    int fCnf;
    int fMulti;
    int fSimple;
    int fFactor;
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nThresh   =  1;
    nFaninMax = 20;
    fCnf      =  0;
    fMulti    =  1;
    fSimple   =  0;
    fFactor   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TFmcsfh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nThresh = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nThresh < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFaninMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFaninMax < 0 )
                goto usage;
            break;
        case 'c':
            fCnf ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 's':
            fSimple ^= 1;
            break;
        case 'f':
            fFactor ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cannot renode a network that is not an AIG (run \"strash\").\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkMulti( pNtk, nThresh, nFaninMax, fCnf, fMulti, fSimple, fFactor );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Renoding has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: multi [-TF <num>] [-msfch]\n" );
    Abc_Print( -2, "\t          transforms an AIG into a logic network by creating larger nodes\n" );
    Abc_Print( -2, "\t-F <num>: the maximum fanin size after renoding [default = %d]\n", nFaninMax );
    Abc_Print( -2, "\t-T <num>: the threshold for AIG node duplication [default = %d]\n", nThresh );
    Abc_Print( -2, "\t          (an AIG node is the root of a new node after renoding\n" );
    Abc_Print( -2, "\t          if this leads to duplication of no more than %d AIG nodes,\n", nThresh );
    Abc_Print( -2, "\t          that is, if [(numFanouts(Node)-1) * size(MFFC(Node))] <= %d)\n", nThresh );
    Abc_Print( -2, "\t-m      : creates multi-input AND graph [default = %s]\n", fMulti? "yes": "no" );
    Abc_Print( -2, "\t-s      : creates a simple AIG (no renoding) [default = %s]\n", fSimple? "yes": "no" );
    Abc_Print( -2, "\t-f      : creates a factor-cut network [default = %s]\n", fFactor? "yes": "no" );
    Abc_Print( -2, "\t-c      : performs renoding to derive the CNF [default = %s]\n", fCnf? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}